

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall
HEkk::initialiseCost(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase,bool perturb)

{
  bool bVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  initialiseLpColCost(this);
  initialiseLpRowCost(this);
  (this->info_).costs_shifted = false;
  (this->info_).costs_perturbed = false;
  (this->analysis_).net_num_single_cost_shift = 0;
  if (algorithm == kPrimal || !perturb) {
    return;
  }
  dVar12 = (this->info_).dual_simplex_cost_perturbation_multiplier;
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    return;
  }
  bVar1 = (this->options_->super_HighsOptionsStruct).output_flag;
  if (bVar1 == true) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "Cost perturbation for %s\n",(this->lp_).model_name_._M_dataplus._M_p);
  }
  uVar8 = (this->lp_).num_col_;
  uVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  dVar15 = 0.0;
  uVar8 = 0;
  dVar12 = INFINITY;
  dVar11 = 0.0;
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    dVar16 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
    dVar13 = ABS(dVar16);
    dVar14 = dVar12;
    if (bVar1 != false) {
      if (((dVar16 != 0.0) || (NAN(dVar16))) &&
         (uVar8 = uVar8 + 1, dVar14 = dVar13, dVar12 <= dVar13)) {
        dVar14 = dVar12;
      }
      dVar15 = dVar15 + dVar13;
    }
    if (dVar13 <= dVar11) {
      dVar13 = dVar11;
    }
    dVar12 = dVar14;
    dVar11 = dVar13;
  }
  if (bVar1 != false) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "   Initially have %d nonzero costs (%3d%%)",(ulong)uVar8);
    if (uVar8 == 0) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  " but perturb as if max cost was 1\n");
      dVar11 = 1.0;
      goto LAB_0032d291;
    }
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                " with min / average / max = %g / %g / %g\n",dVar12,dVar15 / (double)(int)uVar8,
                dVar11);
  }
  if (100.0 < dVar11) {
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    if (bVar1 != false) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "   Large so set max_abs_cost = sqrt(sqrt(max_abs_cost)) = %g\n",dVar11);
    }
  }
LAB_0032d291:
  uVar10 = (long)(this->lp_).num_row_ + (long)(this->lp_).num_col_;
  uVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar10) {
    uVar9 = uVar10 & 0xffffffff;
  }
  dVar12 = 0.0;
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    dVar12 = dVar12 + (double)(-(ulong)((this->info_).workRange_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[uVar7] < 1e+30) &
                              0x3ff0000000000000);
  }
  dVar12 = dVar12 / (double)(int)uVar10;
  if (dVar12 < 0.01) {
    dVar15 = 1.0;
    if (dVar11 <= 1.0) {
      dVar15 = dVar11;
    }
    dVar11 = dVar15;
    if (bVar1 != false) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "   Small boxedRate (%g) so set max_abs_cost = min(max_abs_cost, 1.0) = %g\n",
                  dVar12,dVar11);
    }
  }
  this->cost_perturbation_max_abs_cost_ = dVar11;
  this->cost_perturbation_base_ =
       (this->info_).dual_simplex_cost_perturbation_multiplier * 5e-07 * dVar11;
  if (bVar1 != false) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "   Perturbation column base = %g\n");
  }
  uVar8 = (this->lp_).num_col_;
  pdVar2 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  do {
    if (uVar9 == uVar7) {
      dVar12 = (this->info_).dual_simplex_cost_perturbation_multiplier;
      if (bVar1 != false) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "   Perturbation row    base = %g\n");
        uVar8 = (this->lp_).num_col_;
      }
      pdVar2 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (lVar6 = (long)(int)uVar8; lVar6 < (long)uVar10; lVar6 = lVar6 + 1) {
        pdVar2[lVar6] = (0.5 - pdVar3[lVar6]) * dVar12 * 1e-12 + pdVar2[lVar6];
      }
      (this->info_).costs_perturbed = true;
      return;
    }
    dVar12 = pdVar2[uVar7];
    dVar11 = pdVar3[uVar7];
    dVar15 = pdVar5[uVar7];
    dVar16 = (ABS(dVar15) + 1.0) * (pdVar4[uVar7] + 1.0) * this->cost_perturbation_base_;
    if ((-INFINITY < dVar12) || (dVar11 < INFINITY)) {
      if (dVar11 < INFINITY) {
        if (-INFINITY < dVar12) {
          if ((dVar12 == dVar11) && (!NAN(dVar12) && !NAN(dVar11))) goto LAB_0032d477;
          dVar15 = dVar15 + (double)(~-(ulong)(0.0 <= dVar15) & (ulong)-dVar16 |
                                    -(ulong)(0.0 <= dVar15) & (ulong)dVar16);
        }
        else {
          dVar15 = dVar15 - dVar16;
        }
      }
      else {
        dVar15 = dVar15 + dVar16;
      }
      pdVar5[uVar7] = dVar15;
    }
LAB_0032d477:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void HEkk::initialiseCost(const SimplexAlgorithm algorithm,
                          const HighsInt solve_phase, const bool perturb) {
  // Copy the cost
  initialiseLpColCost();
  initialiseLpRowCost();
  info_.costs_shifted = false;
  info_.costs_perturbed = false;
  analysis_.net_num_single_cost_shift = 0;
  // Primal simplex costs are either from the LP or set specially in phase 1
  if (algorithm == SimplexAlgorithm::kPrimal) return;
  // Dual simplex costs are either from the LP or perturbed
  if (!perturb || info_.dual_simplex_cost_perturbation_multiplier == 0) return;
  // Perturb the original costs, scale down if is too big
  const bool report_cost_perturbation =
      options_->output_flag;  // && analysis_.analyse_simplex_runtime_data;
  HighsInt num_original_nonzero_cost = 0;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "Cost perturbation for %s\n", lp_.model_name_.c_str());
  double min_abs_cost = kHighsInf;
  double max_abs_cost = 0;
  double sum_abs_cost = 0;
  for (HighsInt i = 0; i < lp_.num_col_; i++) {
    const double abs_cost = fabs(info_.workCost_[i]);
    if (report_cost_perturbation) {
      if (abs_cost) {
        num_original_nonzero_cost++;
        min_abs_cost = min(min_abs_cost, abs_cost);
      }
      sum_abs_cost += abs_cost;
    }
    max_abs_cost = max(max_abs_cost, abs_cost);
  }
  const HighsInt pct0 = (100 * num_original_nonzero_cost) / lp_.num_col_;
  double average_abs_cost = 0;
  if (report_cost_perturbation) {
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Initially have %" HIGHSINT_FORMAT
                " nonzero costs (%3" HIGHSINT_FORMAT "%%)",
                num_original_nonzero_cost, pct0);
    if (num_original_nonzero_cost) {
      average_abs_cost = sum_abs_cost / num_original_nonzero_cost;
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  " with min / average / max = %g / %g / %g\n", min_abs_cost,
                  average_abs_cost, max_abs_cost);
    } else {
      min_abs_cost = 1.0;
      max_abs_cost = 1.0;
      average_abs_cost = 1.0;
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  " but perturb as if max cost was 1\n");
    }
  }
  if (max_abs_cost > 100) {
    max_abs_cost = sqrt(sqrt(max_abs_cost));
    if (report_cost_perturbation)
      highsLogDev(
          options_->log_options, HighsLogType::kInfo,
          "   Large so set max_abs_cost = sqrt(sqrt(max_abs_cost)) = %g\n",
          max_abs_cost);
  }

  // If there are few boxed variables, we will just use simple perturbation
  double boxedRate = 0;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt i = 0; i < num_tot; i++)
    boxedRate += (info_.workRange_[i] < 1e30);
  boxedRate /= num_tot;
  if (boxedRate < 0.01) {
    max_abs_cost = min(max_abs_cost, 1.0);
    if (report_cost_perturbation)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "   Small boxedRate (%g) so set max_abs_cost = "
                  "min(max_abs_cost, 1.0) = "
                  "%g\n",
                  boxedRate, max_abs_cost);
  }
  // Determine the perturbation base
  cost_perturbation_max_abs_cost_ = max_abs_cost;
  cost_perturbation_base_ =
      info_.dual_simplex_cost_perturbation_multiplier * 5e-7 * max_abs_cost;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Perturbation column base = %g\n", cost_perturbation_base_);

  // Now do the perturbation
  for (HighsInt i = 0; i < lp_.num_col_; i++) {
    double lower = lp_.col_lower_[i];
    double upper = lp_.col_upper_[i];
    double xpert = (1 + info_.numTotRandomValue_[i]) *
                   (fabs(info_.workCost_[i]) + 1) * cost_perturbation_base_;
    // const double previous_cost = info_.workCost_[i];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free - no perturb
    } else if (upper >= kHighsInf) {  // Lower
      info_.workCost_[i] += xpert;
    } else if (lower <= -kHighsInf) {  // Upper
      info_.workCost_[i] += -xpert;
    } else if (lower != upper) {  // Boxed
      info_.workCost_[i] += (info_.workCost_[i] >= 0) ? xpert : -xpert;
    } else {
      // Fixed - no perturb
    }
    //    if (report_cost_perturbation) {
    //      const double perturbation1 = fabs(info_.workCost_[i] -
    //      previous_cost); if (perturbation1)
    //        updateValueDistribution(perturbation1,
    //                                analysis_.cost_perturbation1_distribution);
    //    }
  }
  const double row_cost_perturbation_base_ =
      info_.dual_simplex_cost_perturbation_multiplier * 1e-12;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Perturbation row    base = %g\n",
                row_cost_perturbation_base_);
  for (HighsInt i = lp_.num_col_; i < num_tot; i++) {
    double perturbation2 =
        (0.5 - info_.numTotRandomValue_[i]) * row_cost_perturbation_base_;
    info_.workCost_[i] += perturbation2;
    //    if (report_cost_perturbation) {
    //      perturbation2 = fabs(perturbation2);
    //      updateValueDistribution(perturbation2,
    //                              analysis_.cost_perturbation2_distribution);
    //    }
  }
  info_.costs_perturbed = true;
}